

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceProcessor::Normalize
          (SentencePieceProcessor *this,string_view input,string *normalized)

{
  long *plVar1;
  undefined8 in_R8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  undefined4 local_190;
  ostringstream local_188 [376];
  
  local_1a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar1 = *(long **)(input._M_len + 0x10);
  if (plVar1 == (long *)0x0) {
    local_190 = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"src/sentencepiece_processor.cc");
    std::operator<<((ostream *)local_188,"(");
    std::ostream::operator<<(local_188,0x3a8);
    std::operator<<((ostream *)local_188,") [");
    std::operator<<((ostream *)local_188,"normalizer_");
    std::operator<<((ostream *)local_188,"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  else {
    (**(code **)(*plVar1 + 0x20))(this,plVar1,input._M_str,normalized,in_R8,&local_1a8);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1a8);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Normalize(absl::string_view input,
                                               std::string *normalized) const {
  std::vector<size_t> norm_to_orig;
  CHECK_OR_RETURN(normalizer_);
  return normalizer_->Normalize(input, normalized, &norm_to_orig);
}